

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis_weighted<float,int,std::vector<double,std::allocator<double>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
                 int *Xc_indptr,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  unsigned_long *puVar6;
  int *piVar7;
  long lVar8;
  size_t sVar9;
  ulong *puVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_b8;
  double local_b0;
  double local_a0;
  double local_80;
  double local_78;
  
  lVar8 = (long)Xc_indptr[col_num];
  lVar5 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] != Xc_indptr[col_num + 1]) {
    local_b0 = 0.0;
    for (sVar9 = st; sVar9 <= end; sVar9 = sVar9 + 1) {
      local_b0 = local_b0 +
                 (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[ix_arr[sVar9]];
    }
    if (0.0 < local_b0) {
      piVar1 = Xc_ind + lVar5;
      iVar2 = piVar1[-1];
      puVar10 = ix_arr + end + 1;
      puVar6 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                         (ix_arr + st,puVar10,Xc_ind + lVar8);
      local_b8 = 0.0;
      if (missing_action == Fail) {
        local_78 = 0.0;
        local_80 = 0.0;
        local_a0 = 0.0;
LAB_00237326:
        do {
          piVar7 = Xc_ind + lVar8;
          while( true ) {
            uVar11 = SUB84(local_b0,0);
            uVar12 = (undefined4)((ulong)local_b0 >> 0x20);
            if (((puVar6 == puVar10) || (lVar8 == lVar5)) ||
               (uVar3 = *puVar6, (ulong)(long)iVar2 < uVar3)) goto LAB_002374bd;
            if (*piVar7 == (int)uVar3) {
              dVar15 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar3];
              dVar14 = (double)Xc[lVar8];
              dVar13 = dVar14 * dVar14;
              local_b8 = fma(dVar15,dVar14,local_b8);
              local_a0 = fma(dVar15,dVar13,local_a0);
              local_80 = fma(dVar15,dVar14 * dVar13,local_80);
              local_78 = fma(dVar15,dVar13 * dVar13,local_78);
              if ((puVar6 == ix_arr + end) || (lVar8 == lVar5 + -1)) goto LAB_002374bd;
              puVar6 = puVar6 + 1;
              piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                 (piVar7 + 1,piVar1,puVar6);
              lVar8 = (long)piVar7 - (long)Xc_ind >> 2;
              goto LAB_00237326;
            }
            if (*piVar7 <= (int)uVar3) break;
            puVar6 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar6 + 1,puVar10,piVar7);
          }
          piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (piVar7 + 1,piVar1,puVar6);
          lVar8 = (long)piVar7 - (long)Xc_ind >> 2;
        } while( true );
      }
      local_78 = 0.0;
      local_80 = 0.0;
      dVar15 = 0.0;
      local_a0 = local_b8;
LAB_0023716a:
      local_b8 = dVar15;
      piVar7 = Xc_ind + lVar8;
      do {
        if (((puVar6 == puVar10) || (lVar8 == lVar5)) ||
           (uVar3 = *puVar6, (ulong)(long)iVar2 < uVar3)) {
LAB_0023749f:
          uVar11 = SUB84(local_b0,0);
          uVar12 = (undefined4)((ulong)local_b0 >> 0x20);
          if (local_b0 <= 0.0) {
            return -INFINITY;
          }
LAB_002374bd:
          if ((double)CONCAT44(uVar12,uVar11) <= 1.0) {
            return -INFINITY;
          }
          dVar15 = (double)CONCAT44(uVar12,uVar11);
          if ((local_a0 == 0.0) && (!NAN(local_a0))) {
            return -INFINITY;
          }
          if ((local_a0 == local_b8 * local_b8) && (!NAN(local_a0) && !NAN(local_b8 * local_b8))) {
            return -INFINITY;
          }
          dVar16 = local_b8 / dVar15;
          dVar14 = dVar16 * dVar16;
          dVar13 = local_a0 / dVar15 - dVar14;
          if (NAN(dVar13)) {
            return -INFINITY;
          }
          if ((dVar13 <= 2.220446049250313e-16) &&
             (bVar4 = check_more_than_two_unique_values<float,int>
                                (ix_arr,st,end,col_num,Xc_indptr,Xc_ind,Xc,missing_action), !bVar4))
          {
            return -INFINITY;
          }
          if (dVar13 <= 0.0) {
            return 0.0;
          }
          dVar15 = (dVar14 * dVar16 * dVar16 * dVar15 +
                   local_b8 * -4.0 * dVar14 * dVar16 +
                   local_a0 * 6.0 * dVar14 + local_80 * -4.0 * dVar16 + local_78) /
                   (dVar13 * dVar13 * dVar15);
          if (0x7fefffffffffffff < (long)ABS(dVar15)) {
            return -INFINITY;
          }
          if (0.0 < dVar15) {
            return dVar15;
          }
          return 0.0;
        }
        if (*piVar7 == (int)uVar3) {
          dVar15 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar3];
          dVar14 = (double)Xc[lVar8];
          if ((NAN(Xc[lVar8])) || (ABS(dVar14) == INFINITY)) {
            local_b0 = local_b0 - dVar15;
          }
          else {
            dVar13 = dVar14 * dVar14;
            local_b8 = fma(dVar15,dVar14,local_b8);
            local_a0 = fma(dVar15,dVar13,local_a0);
            local_80 = fma(dVar15,dVar14 * dVar13,local_80);
            local_78 = fma(dVar15,dVar13 * dVar13,local_78);
          }
          if ((puVar6 == ix_arr + end) || (lVar8 == lVar5 + -1)) goto LAB_0023749f;
          puVar6 = puVar6 + 1;
          piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (piVar7 + 1,piVar1,puVar6);
          lVar8 = (long)piVar7 - (long)Xc_ind >> 2;
          dVar15 = local_b8;
          goto LAB_0023716a;
        }
        if (*piVar7 <= (int)uVar3) goto LAB_002371b3;
        puVar6 = std::__lower_bound<unsigned_long*,int,__gnu_cxx::__ops::_Iter_less_val>
                           (puVar6 + 1,puVar10,piVar7);
      } while( true );
    }
  }
  return -INFINITY;
LAB_002371b3:
  piVar7 = std::__lower_bound<int*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (piVar7 + 1,piVar1,puVar6);
  lVar8 = (long)piVar7 - (long)Xc_ind >> 2;
  dVar15 = local_b8;
  goto LAB_0023716a;
}

Assistant:

double calc_kurtosis_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                              real_t Xc[], sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = 0;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];

                if (unlikely(is_na_or_inf(xval)))
                {
                    cnt -= w_this;
                }

                else
                {
                    x_sq = xval * xval;
                    s1 = std::fma(w_this, xval, s1);
                    s2 = std::fma(w_this, x_sq, s2);
                    s3 = std::fma(w_this, x_sq*xval, s3);
                    s4 = std::fma(w_this, x_sq*x_sq, s4);
                    // s1 += w_this * pw1(xval);
                    // s2 += w_this * pw2(xval);
                    // s3 += w_this * pw3(xval);
                    // s4 += w_this * pw4(xval);
                }

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

        if (unlikely(cnt <= 0)) return -HUGE_VAL;
    }

    else
    {
        for (size_t *row = ptr_st;
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                w_this = w[*row];
                xval = Xc[curr_pos];
                
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);

                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(ix_arr, st, end, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (v <= 0) return 0.;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}